

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O1

void __thiscall pg::NPPSolver::run(NPPSolver *this)

{
  bitset *pbVar1;
  uidlvector *this_00;
  list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
  *plVar2;
  Game *pGVar3;
  uint64_t *puVar4;
  uint64_t *puVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  size_t sVar9;
  ulong *puVar10;
  _List_node_base *this_01;
  bool bVar11;
  int iVar12;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  bitset *pbVar13;
  _Node *p_Var14;
  ostream *poVar15;
  uint uVar16;
  uint prt;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->Phase,true);
  pbVar1 = &this->outgame;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pbVar1;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Supgame,(bitset **)&local_88)
  ;
  this_02 = (_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x50);
  (this_02->_M_impl).super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_map_size = 0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this_02->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(this_02,0);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)this_02;
  std::
  vector<std::deque<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>*>>
  ::emplace_back<std::deque<unsigned_int,std::allocator<unsigned_int>>*>
            ((vector<std::deque<unsigned_int,std::allocator<unsigned_int>>*,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>*>>
              *)&this->Heads,(deque<unsigned_int,_std::allocator<unsigned_int>_> **)&local_88);
  pbVar13 = (bitset *)operator_new(0x20);
  bitset::bitset(pbVar13,((this->super_Solver).game)->n_vertices);
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pbVar13;
  std::vector<pg::bitset*,std::allocator<pg::bitset*>>::emplace_back<pg::bitset*>
            ((vector<pg::bitset*,std::allocator<pg::bitset*>> *)&this->Exits,(bitset **)&local_88);
  this_00 = &this->Entries;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)operator_new(0x18);
  *local_88._M_impl.super__Deque_impl_data._M_map = (uint *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map[1] = (uint *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map[2] = (uint *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map[1] =
       (uint *)local_88._M_impl.super__Deque_impl_data._M_map;
  *local_88._M_impl.super__Deque_impl_data._M_map =
       (uint *)local_88._M_impl.super__Deque_impl_data._M_map;
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*,std::allocator<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>>
  ::
  emplace_back<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>
            ((vector<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*,std::allocator<std::__cxx11::list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>*>>
              *)this_00,
             (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              **)&local_88);
  plVar2 = (list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
            *)*(this->Entries).
               super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
  p_Var14 = std::__cxx11::
            list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
            ::_M_create_node<std::deque<unsigned_int,std::allocator<unsigned_int>>>
                      (plVar2,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
  std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
  plVar2 = plVar2 + 0x10;
  *(long *)plVar2 = *(long *)plVar2 + 1;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
  pGVar3 = (this->super_Solver).game;
  puVar4 = ((this->super_Solver).disabled)->_bits;
  uVar16 = (int)pGVar3->n_vertices - 1;
  uVar19 = (ulong)uVar16;
  uVar20 = (ulong)(int)uVar16;
  uVar17 = uVar20 >> 6;
  if ((puVar4[uVar17] >> (uVar19 & 0x3f) & 1) != 0) {
    puVar5 = pbVar1->_bits;
    uVar20 = uVar19;
    do {
      puVar5[uVar17] = puVar5[uVar17] | 1L << (uVar20 & 0x3f);
      uVar16 = (int)uVar19 - 1;
      uVar19 = (ulong)uVar16;
      uVar20 = (ulong)(int)uVar16;
      uVar17 = uVar20 >> 6;
    } while ((puVar4[uVar17] >> (uVar20 & 0x3f) & 1) != 0);
  }
  this->pos = uVar16;
  piVar6 = pGVar3->_priority;
  this->maxprio = piVar6[uVar20];
  piVar7 = this->inverse;
  uVar20 = 0;
  do {
    piVar7[uVar20] = -1;
    uVar16 = (int)uVar20 + 1;
    uVar20 = (ulong)uVar16;
  } while (uVar16 <= this->maxprio);
  if (-1 < this->pos) {
    puVar5 = (this->outgame)._bits;
    piVar7 = this->strategy;
    piVar8 = this->inverse;
    uVar20 = 0;
    do {
      if ((puVar4[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0) {
        piVar8[piVar6[uVar20]] = (int)uVar20;
        piVar7[uVar20] = -1;
      }
      else {
        puVar10 = puVar5 + (uVar20 >> 6);
        *puVar10 = *puVar10 | 1L << (uVar20 & 0x3f);
      }
      bVar11 = (long)uVar20 < (long)this->pos;
      uVar20 = uVar20 + 1;
    } while (bVar11);
  }
  if (-1 < this->pos) {
    do {
      this->doms = this->doms + 1;
      this->p = this->maxprio;
      this->alpha = this->maxprio & 1;
      (*(this->super_Solver)._vptr_Solver[7])(this);
      sVar9 = (this->outgame)._bitssize;
      if (sVar9 != 0) {
        puVar4 = (this->outgame)._bits;
        puVar5 = (this->R)._bits;
        sVar18 = 0;
        do {
          puVar10 = puVar4 + sVar18;
          *puVar10 = *puVar10 | puVar5[sVar18];
          sVar18 = sVar18 + 1;
        } while (sVar9 != sVar18);
      }
      if ((this->alpha == 0) && (sVar9 = (this->winzero)._bitssize, sVar9 != 0)) {
        puVar4 = (this->winzero)._bits;
        puVar5 = (this->R)._bits;
        sVar18 = 0;
        do {
          puVar10 = puVar4 + sVar18;
          *puVar10 = *puVar10 | puVar5[sVar18];
          sVar18 = sVar18 + 1;
        } while (sVar9 != sVar18);
      }
      iVar12 = this->inverse[this->maxprio];
      uVar20 = (ulong)iVar12;
      bVar11 = (long)uVar20 >= 0;
      if ((long)uVar20 < 0) {
LAB_00150654:
        this->pos = iVar12;
      }
      else {
        uVar19 = uVar20 >> 6;
        while (iVar12 = (int)uVar20, (pbVar1->_bits[uVar19] >> (uVar20 & 0x3f) & 1) != 0) {
          bVar11 = 0 < iVar12;
          if (iVar12 < 1) {
            iVar12 = -1;
            goto LAB_00150654;
          }
          uVar19 = (ulong)(iVar12 - 1U >> 6);
          uVar20 = (ulong)(iVar12 - 1U);
        }
        this->pos = iVar12;
        if (bVar11) {
          this->maxprio = ((this->super_Solver).game)->_priority[uVar20 & 0xffffffff];
        }
      }
      this->Pivot = 0;
      this->Top = 0;
      puVar10 = (this->Phase).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      *puVar10 = *puVar10 | 1;
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::clear
                (*(this->Heads).
                  super__Vector_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                  ._M_impl.super__Vector_impl_data._M_start);
      pbVar13 = *(this->Exits).super__Vector_base<pg::bitset_*,_std::allocator<pg::bitset_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      sVar9 = pbVar13->_bitssize;
      if (sVar9 != 0) {
        memset(pbVar13->_bits,0,sVar9 << 3);
      }
      this_01 = (_List_node_base *)
                *(this_00->
                 super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::
      _List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::_M_clear((_List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)this_01);
      this_01->_M_prev = this_01;
      this_01->_M_next = this_01;
      this_01[1]._M_next = (_List_node_base *)0x0;
      plVar2 = (list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
                *)*(this_00->
                   super__Vector_base<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
      local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_88,0);
      p_Var14 = std::__cxx11::
                list<std::deque<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::deque<unsigned_int,std::allocator<unsigned_int>>>>
                ::_M_create_node<std::deque<unsigned_int,std::allocator<unsigned_int>>>
                          (plVar2,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_88);
      std::__detail::_List_node_base::_M_hook(&p_Var14->super__List_node_base);
      plVar2 = plVar2 + 0x10;
      *(long *)plVar2 = *(long *)plVar2 + 1;
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_88);
      sVar9 = (this->R)._bitssize;
      if (sVar9 != 0) {
        memset((this->R)._bits,0,sVar9 << 3);
      }
    } while (-1 < this->pos);
  }
  this->pos = 0;
  if (0 < ((this->super_Solver).game)->n_vertices) {
    uVar20 = 0;
    do {
      if ((((this->super_Solver).disabled)->_bits[uVar20 >> 6] >> (uVar20 & 0x3f) & 1) == 0) {
        Oink::solve((this->super_Solver).oink,(int)uVar20,
                    (uint)(((this->winzero)._bits[uVar20 >> 6] & 1L << (uVar20 & 0x3f)) == 0),
                    this->strategy[uVar20]);
      }
      uVar20 = (long)this->pos + 1;
      this->pos = (int)uVar20;
    } while ((long)uVar20 < ((this->super_Solver).game)->n_vertices);
  }
  poVar15 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"solved with ",0xc);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," total queries and ",0x13);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," total promotions;",0x12);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  poVar15 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"            ",0xc);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," max queries and ",0x11);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," max promotions;",0x10);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  poVar15 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar15,"            ",0xc);
  poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)poVar15);
  std::__ostream_insert<char,std::char_traits<char>>(poVar15," dominions.",0xb);
  std::ios::widen((char)poVar15->_vptr_basic_ostream[-3] + (char)poVar15);
  std::ostream::put((char)poVar15);
  std::ostream::flush();
  return;
}

Assistant:

void NPPSolver::run()
{

    /* vv Stack initialization vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    Phase.push_back(true);
    Supgame.push_back(&outgame);
    Heads.push_back(new uideque());
    Exits.push_back(new bitset(nodecount()));
    Entries.push_back(new uidlist());
    Entries[0]->push_front(uideque());
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = nodecount() - 1;; --pos)
    {
        if (disabled[pos])
        {
            outgame[pos] = true;
        }
        else
        {
            maxprio = priority(pos);
            break;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of inverse, outgame, and strategy vvvvvvvvvvvvvvvvvvvv */
    for (uint prt = 0; prt <= maxprio; ++prt)
    {
        inverse[prt] = -1;
    }
    for (int sop = 0; sop <= pos; sop++)
    {
        if (disabled[sop])
        {
            outgame[sop] = true;
        }
        else
        {
            inverse[priority(sop)] = sop;
            strategy[sop] = -1;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Main solution cycle vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    while (pos >= 0)
    {

        /* vv Update of the statistic on the number of dominions vvvvvvvvvvvvvvvv */
        doms++;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Setting of the initial priority and parity vvvvvvvvvvvvvvvvvvvvvvvv */
        p = maxprio;
        alpha = p & 1;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Call to the search routine and update of the zero winning region vv */
        search();
        outgame |= R;
        if (alpha == 0)
        {
            winzero |= R;
        }
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Search for the new pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        for (pos = inverse[maxprio]; pos >= 0 && outgame[pos]; --pos)
        {
        }
        if (pos >= 0) maxprio = priority(pos);
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Stack and current region cleaning vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        Top = Pivot = 0;
        Phase[0] = true;
        Heads[0]->clear();
        Exits[0]->reset();
        Entries[0]->clear();
        Entries[0]->push_front(uideque());
        R.reset();
        // /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Setting of the final solution vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = 0; pos < nodecount(); ++pos)
    {
        if (disabled[pos]) continue;
        Solver::solve(pos, !winzero[pos], strategy[pos]);
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Printing of statistics vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    logger << "solved with " << totqueries << " total queries and " << totpromos << " total promotions;" << std::endl;
    logger << "            " << maxqueries << " max queries and " << maxpromos << " max promotions;" << std::endl;
    logger << "            " << doms << " dominions." << std::endl;
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */
}